

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

uint8_t * icu_63::BytesTrie::findUniqueValueFromBranch
                    (uint8_t *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  int32_t value;
  UBool isFinal;
  int32_t node;
  int32_t *uniqueValue_local;
  UBool haveUniqueValue_local;
  uint8_t *puStack_18;
  int32_t length_local;
  uint8_t *pos_local;
  
  uniqueValue_local._4_4_ = length;
  puStack_18 = pos;
  while (uniqueValue_local._3_1_ = haveUniqueValue, 5 < uniqueValue_local._4_4_) {
    puVar4 = jumpByDelta(puStack_18 + 1);
    puVar4 = findUniqueValueFromBranch
                       (puVar4,uniqueValue_local._4_4_ >> 1,haveUniqueValue,uniqueValue);
    if (puVar4 == (uint8_t *)0x0) {
      return (uint8_t *)0x0;
    }
    uniqueValue_local._4_4_ = uniqueValue_local._4_4_ - (uniqueValue_local._4_4_ >> 1);
    puStack_18 = skipDelta(puStack_18 + 1);
  }
  do {
    bVar1 = puStack_18[1];
    iVar3 = readValue(puStack_18 + 2,(int)(uint)bVar1 >> 1);
    puStack_18 = skipValue(puStack_18 + 2,(uint)bVar1);
    if ((bVar1 & 1) == 0) {
      UVar2 = findUniqueValue(puStack_18 + iVar3,uniqueValue_local._3_1_,uniqueValue);
      if (UVar2 == '\0') {
        return (uint8_t *)0x0;
      }
      uniqueValue_local._3_1_ = '\x01';
    }
    else if (uniqueValue_local._3_1_ == '\0') {
      *uniqueValue = iVar3;
      uniqueValue_local._3_1_ = '\x01';
    }
    else if (iVar3 != *uniqueValue) {
      return (uint8_t *)0x0;
    }
    uniqueValue_local._4_4_ = uniqueValue_local._4_4_ + -1;
  } while (1 < uniqueValue_local._4_4_);
  return puStack_18 + 1;
}

Assistant:

const uint8_t *
BytesTrie::findUniqueValueFromBranch(const uint8_t *pos, int32_t length,
                                     UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison byte
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node&kValueIsFinal);
        int32_t value=readValue(pos, node>>1);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison byte
}